

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_page_by_mmuidx_arm(CPUState *cpu,target_ulong_conflict addr,uint16_t idxmap)

{
  uc_struct_conflict1 *uc;
  uint16_t idxmap_local;
  target_ulong_conflict addr_local;
  CPUState *cpu_local;
  
  tlb_flush_page_by_mmuidx_async_0(cpu,cpu->uc->init_target_page->mask & addr,idxmap);
  return;
}

Assistant:

void tlb_flush_page_by_mmuidx(CPUState *cpu, target_ulong addr, uint16_t idxmap)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif

    /* This should already be page aligned */
    addr &= TARGET_PAGE_MASK;

    // if (qemu_cpu_is_self(cpu)) {
        tlb_flush_page_by_mmuidx_async_0(cpu, addr, idxmap);
    //}
#if 0
    else if (idxmap < TARGET_PAGE_SIZE) {
        /*
         * Most targets have only a few mmu_idx.  In the case where
         * we can stuff idxmap into the low TARGET_PAGE_BITS, avoid
         * allocating memory for this operation.
         */
        tlb_flush_page_by_mmuidx_async_1(cpu, RUN_ON_CPU_TARGET_PTR(addr | idxmap));
    } else {
        TLBFlushPageByMMUIdxData *d = g_new(TLBFlushPageByMMUIdxData, 1);

        /* Otherwise allocate a structure, freed by the worker.  */
        d->addr = addr;
        d->idxmap = idxmap;
        tlb_flush_page_by_mmuidx_async_2(cpu, RUN_ON_CPU_HOST_PTR(d));
    }
#endif
}